

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkAddBuffsInt(Abc_Ntk_t *pNtkInit,int fReverse,int nImprove,int fVerbose)

{
  uint *puVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  int *piVar4;
  Abc_Obj_t *pFanin;
  bool bVar5;
  uint nLevelMax;
  int iVar6;
  int iVar7;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Abc_Obj_t *pFaninNew;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  
  pNtk = Abc_NtkDup(pNtkInit);
  nLevelMax = Abc_NtkLevel(pNtk);
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      *(uint *)((long)pVVar8->pArray[lVar11] + 0x14) =
           *(uint *)((long)pVVar8->pArray[lVar11] + 0x14) & 0xfff | nLevelMax * 0x1000 + 0x1000;
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar11 < pVVar8->nSize);
  }
  pVVar8 = Abc_NtkDfs(pNtk,1);
  if (fReverse == 0) {
    if (0 < nImprove) {
      iVar7 = 0;
      do {
        iVar19 = 0;
        if (0 < (long)pVVar8->nSize) {
          iVar19 = 0;
          lVar11 = (long)pVVar8->nSize;
          do {
            if (pVVar8->nSize < lVar11) goto LAB_001fd320;
            pAVar3 = (Abc_Obj_t *)pVVar8->pArray[lVar11 + -1];
            uVar14 = *(uint *)&pAVar3->field_0x14;
            uVar13 = uVar14 >> 0xc;
            if (nLevelMax < uVar13) {
              __assert_fail("pObj->Level <= (unsigned)nLevelMax",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                            ,0x94e,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
            }
            lVar20 = (long)(pAVar3->vFanouts).nSize;
            if (0 < lVar20) {
              lVar15 = 0;
              do {
                uVar12 = *(uint *)((long)pAVar3->pNtk->vObjs->pArray
                                         [(pAVar3->vFanouts).pArray[lVar15]] + 0x14) >> 0xc;
                if (uVar12 <= uVar13) {
                  __assert_fail("pFanin->Level > pObj->Level",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                                ,0x951,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
                }
                if (uVar12 == uVar13 + 1) goto LAB_001fd0f3;
                lVar15 = lVar15 + 1;
              } while (lVar20 != lVar15);
            }
            lVar20 = (long)(pAVar3->vFanins).nSize;
            if (lVar20 < 1) {
LAB_001fd0dc:
              *(uint *)&pAVar3->field_0x14 = uVar14 + 0x1000;
              iVar19 = iVar19 + 1;
            }
            else {
              piVar4 = (pAVar3->vFanins).pArray;
              ppvVar10 = pAVar3->pNtk->vObjs->pArray;
              iVar18 = 1;
              lVar15 = 0;
              do {
                uVar13 = Abc_NtkAddBuffsEval2(pAVar3,(Abc_Obj_t *)ppvVar10[piVar4[lVar15]]);
                iVar18 = iVar18 - (uVar13 ^ 1);
                lVar15 = lVar15 + 1;
              } while (lVar20 != lVar15);
              if (-1 < iVar18) goto LAB_001fd0dc;
            }
LAB_001fd0f3:
            bVar5 = 1 < lVar11;
            lVar11 = lVar11 + -1;
          } while (bVar5);
        }
        if (fVerbose != 0) {
          printf("Shifted %5d nodes up with total gain %5d.\n");
        }
      } while ((iVar19 != 0) && (iVar7 = iVar7 + 1, iVar7 != nImprove));
    }
  }
  else {
    if (0x3ffff < (int)nLevelMax) {
      __assert_fail("nLevelMax < (1<<18)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                    ,0x919,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
    }
    lVar11 = (long)pVVar8->nSize;
    if (0 < lVar11) {
      do {
        if (pVVar8->nSize < (int)lVar11) {
LAB_001fd320:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar11 = lVar11 + -1;
        plVar2 = (long *)pVVar8->pArray[lVar11];
        uVar14 = *(uint *)((long)plVar2 + 0x14) & 0xfff | 0x40000000;
        *(uint *)((long)plVar2 + 0x14) = uVar14;
        if (0 < (long)*(int *)((long)plVar2 + 0x2c)) {
          uVar17 = 0;
          do {
            uVar12 = (*(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)(plVar2[6] + uVar17 * 4) * 8) + 0x14) >> 0xc)
                     - 1;
            uVar13 = uVar14 >> 0xc;
            if ((int)uVar12 < (int)(uVar14 >> 0xc)) {
              uVar13 = uVar12;
            }
            uVar14 = uVar14 & 0xfff | uVar13 << 0xc;
            *(uint *)((long)plVar2 + 0x14) = uVar14;
            uVar17 = uVar17 + 1;
          } while (uVar17 < (ulong)(long)*(int *)((long)plVar2 + 0x2c));
          if ((uVar13 & 0xfffff) == 0) {
            __assert_fail("pObj->Level > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                          ,0x91f,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
          }
        }
      } while (0 < (int)lVar11);
    }
    pVVar9 = pNtk->vCis;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        puVar1 = (uint *)((long)pVVar9->pArray[lVar11] + 0x14);
        *puVar1 = *puVar1 & 0xfff;
        lVar11 = lVar11 + 1;
        pVVar9 = pNtk->vCis;
      } while (lVar11 < pVVar9->nSize);
    }
    if (0 < nImprove) {
      iVar7 = 0;
      do {
        iVar19 = pVVar8->nSize;
        uVar13 = 0;
        uVar14 = 0;
        if (0 < iVar19) {
          lVar11 = 0;
          uVar14 = 0;
          uVar13 = 0;
          do {
            pAVar3 = (Abc_Obj_t *)pVVar8->pArray[lVar11];
            uVar12 = *(uint *)&pAVar3->field_0x14;
            if (uVar12 < 0x1000) {
              __assert_fail("pObj->Level > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                            ,0x92b,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
            }
            iVar18 = (pAVar3->vFanins).nSize;
            lVar20 = (long)iVar18;
            if (0 < lVar20) {
              lVar15 = 0;
              do {
                uVar16 = *(uint *)((long)pAVar3->pNtk->vObjs->pArray
                                         [(pAVar3->vFanins).pArray[lVar15]] + 0x14) >> 0xc;
                if (uVar12 >> 0xc <= uVar16) {
                  __assert_fail("pFanin->Level < pObj->Level",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                                ,0x92e,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
                }
                if (uVar16 + 1 == uVar12 >> 0xc) goto LAB_001fcf7b;
                lVar15 = lVar15 + 1;
              } while (lVar20 != lVar15);
              if (0 < iVar18) {
                piVar4 = (pAVar3->vFanins).pArray;
                ppvVar10 = pAVar3->pNtk->vObjs->pArray;
                iVar18 = -1;
                lVar15 = 0;
                do {
                  iVar6 = Abc_NtkAddBuffsEval(pAVar3,(Abc_Obj_t *)ppvVar10[piVar4[lVar15]]);
                  iVar18 = iVar18 + iVar6;
                  lVar15 = lVar15 + 1;
                } while (lVar20 != lVar15);
                if (-1 < iVar18) {
                  *(uint *)&pAVar3->field_0x14 = uVar12 - 0x1000;
                  uVar13 = uVar13 + 1;
                  uVar14 = uVar14 + iVar18;
                  iVar19 = pVVar8->nSize;
                }
              }
            }
LAB_001fcf7b:
            lVar11 = lVar11 + 1;
          } while (lVar11 < iVar19);
        }
        if (fVerbose != 0) {
          printf("Shifted %5d nodes down with total gain %5d.\n",(ulong)uVar13,(ulong)uVar14);
        }
      } while ((uVar13 != 0) && (iVar7 = iVar7 + 1, iVar7 != nImprove));
    }
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  pVVar8 = pNtk->vObjs;
  uVar14 = pVVar8->nSize;
  iVar19 = (nLevelMax + 1) * uVar14;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar19 - 1U) {
    iVar7 = iVar19;
  }
  pVVar9->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar9->pArray = ppvVar10;
  pVVar9->nSize = iVar19;
  memset(ppvVar10,0,(long)iVar19 << 3);
  if (0 < (int)uVar14) {
    uVar17 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar8->pArray[uVar17];
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        if (uVar17 == uVar14) break;
        uVar13 = *(uint *)&pAVar3->field_0x14 & 0xf;
        if (((uVar13 < 8) && ((0x98U >> uVar13 & 1) != 0)) &&
           (iVar7 = (pAVar3->vFanins).nSize, 0 < iVar7)) {
          lVar11 = 0;
          do {
            pFanin = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar11]];
            uVar12 = *(uint *)&pAVar3->field_0x14 >> 0xc;
            uVar13 = *(uint *)&pFanin->field_0x14 >> 0xc;
            if (uVar12 <= uVar13) {
              __assert_fail("Abc_ObjLevel(pObj) - 1 >= Abc_ObjLevel(pFanin)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                            ,0x970,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
            }
            uVar12 = uVar12 - 1;
            if (uVar12 != uVar13) {
              pFaninNew = Abc_NtkAddBuffsOne(pVVar9,pFanin,uVar12,nLevelMax);
              Abc_ObjPatchFanin(pAVar3,pFanin,pFaninNew);
              iVar7 = (pAVar3->vFanins).nSize;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < iVar7);
          pVVar8 = pNtk->vObjs;
        }
      }
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)pVVar8->nSize);
  }
  if (ppvVar10 != (void **)0x0) {
    free(ppvVar10);
  }
  free(pVVar9);
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      puVar1 = (uint *)((long)pVVar8->pArray[lVar11] + 0x14);
      *puVar1 = *puVar1 & 0xfff;
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar11 < pVVar8->nSize);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkAddBuffsInt( Abc_Ntk_t * pNtkInit, int fReverse, int nImprove, int fVerbose )
{
    Vec_Ptr_t * vBuffs;
    Abc_Ntk_t * pNtk = Abc_NtkDup( pNtkInit );
    Abc_Obj_t * pObj, * pFanin, * pBuffer;
    int i, k, Iter, nLevelMax = Abc_NtkLevel( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->Level = nLevelMax + 1;
    if ( fReverse )
    {
        Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 1 );
        assert( nLevelMax < (1<<18) );
        Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
        {
            pObj->Level = (1<<18);
            Abc_ObjForEachFanout( pObj, pFanin, k )
                pObj->Level = Abc_MinInt( pFanin->Level - 1, pObj->Level );
            assert( pObj->Level > 0 );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->Level = 0;

        // move the nodes down one step at a time
        for ( Iter = 0; Iter < nImprove; Iter++ )
        {
            int Counter = 0, TotalGain = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            {
                int CountGain = -1;
                assert( pObj->Level > 0 );
                Abc_ObjForEachFanin( pObj, pFanin, k )
                {
                    assert( pFanin->Level < pObj->Level );
                    if ( pFanin->Level + 1 == pObj->Level )
                        break;
                }
                if ( k < Abc_ObjFaninNum(pObj) ) // cannot move
                    continue;
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    CountGain += Abc_NtkAddBuffsEval( pObj, pFanin );
                if ( CountGain >= 0 ) // can move
                {
                    pObj->Level--;
                    Counter++;
                    TotalGain += CountGain;
                }
            }
            if ( fVerbose )
                printf( "Shifted %5d nodes down with total gain %5d.\n", Counter, TotalGain );
            if ( Counter == 0 )
                break;
        }
        Vec_PtrFree( vNodes );
    }
    else
    {
        // move the nodes up one step at a time
        Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 1 );
        for ( Iter = 0; Iter < nImprove; Iter++ )
        {
            int Counter = 0, TotalGain = 0;
            Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
            {
                int CountGain = 1;
                assert( pObj->Level <= (unsigned)nLevelMax );
                Abc_ObjForEachFanout( pObj, pFanin, k )
                {
                    assert( pFanin->Level > pObj->Level );
                    if ( pFanin->Level == pObj->Level + 1 )
                        break;
                }
                if ( k < Abc_ObjFanoutNum(pObj) ) // cannot move
                    continue;
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    CountGain -= !Abc_NtkAddBuffsEval2( pObj, pFanin );
                if ( CountGain >= 0 ) // can move
                {
                    pObj->Level++;
                    Counter++;
                    TotalGain += CountGain;
                }
            } 
            if ( fVerbose )
                printf( "Shifted %5d nodes up with total gain %5d.\n", Counter, TotalGain );
            if ( Counter == 0 )
                break;
        }
        Vec_PtrFree( vNodes );
    }
    vBuffs = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) * (nLevelMax + 1) );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( i == Vec_PtrSize(vBuffs) / (nLevelMax + 1) )
            break;
        if ( !Abc_ObjIsNode(pObj) && !Abc_ObjIsCo(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( Abc_ObjLevel(pObj) - 1 >= Abc_ObjLevel(pFanin) );
            if ( Abc_ObjLevel(pObj) - 1 == Abc_ObjLevel(pFanin) )
                continue;
            pBuffer = Abc_NtkAddBuffsOne( vBuffs, pFanin, Abc_ObjLevel(pObj) - 1, nLevelMax );
            Abc_ObjPatchFanin( pObj, pFanin, pBuffer );
        }
    }
    Vec_PtrFree( vBuffs );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->Level = 0;
    return pNtk;
}